

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O0

cali_variant_t cali_channel_get(cali_id_t chn_id,cali_id_t attr_id)

{
  bool bVar1;
  ChannelBody *chB;
  cali_variant_t cVar2;
  Attribute local_98;
  Entry local_90;
  cali_variant_t local_78;
  undefined4 local_68;
  undefined1 local_58 [8];
  Channel channel;
  Caliper c;
  cali_id_t attr_id_local;
  cali_id_t chn_id_local;
  
  cali::Caliper::sigsafe_instance();
  cali::Caliper::get_channel
            ((Caliper *)local_58,
             (cali_id_t)
             &channel.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  bVar1 = cali::Caliper::operator_cast_to_bool
                    ((Caliper *)
                     &channel.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
  if ((bVar1) && (bVar1 = cali::Channel::operator_cast_to_bool((Channel *)local_58), bVar1)) {
    chB = cali::Channel::body((Channel *)local_58);
    local_98 = cali::Caliper::get_attribute
                         ((Caliper *)
                          &channel.mP.
                           super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount,attr_id);
    cali::Caliper::get(&local_90,
                       (Caliper *)
                       &channel.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount,chB,&local_98);
    local_78 = (cali_variant_t)cali::Entry::value(&local_90);
    cVar2 = cali::Variant::c_variant((Variant *)&local_78);
  }
  else {
    cVar2 = cali_make_empty_variant();
  }
  local_68 = 1;
  cali::Channel::~Channel((Channel *)local_58);
  cali::Caliper::~Caliper
            ((Caliper *)
             &channel.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return cVar2;
}

Assistant:

cali_variant_t cali_channel_get(cali_id_t chn_id, cali_id_t attr_id)
{
    Caliper c       = Caliper::sigsafe_instance();
    Channel channel = c.get_channel(chn_id);

    if (!c || !channel)
        return cali_make_empty_variant();

    return c.get(channel.body(), c.get_attribute(attr_id)).value().c_variant();
}